

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O1

void __thiscall cmInstallFilesCommand::CreateInstallGenerator(cmInstallFilesCommand *this)

{
  pointer *ppbVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  MessageLevel message;
  string *psVar4;
  cmInstallFilesGenerator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_configurations;
  string destination;
  string no_component;
  
  std::__cxx11::string::substr((ulong)&destination,(ulong)&this->Destination);
  cmsys::SystemTools::ConvertToUnixSlashes(&destination);
  if (destination._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&destination,0,(char *)0x0,0x4f8a5e);
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  ppbVar1 = &no_configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&no_configurations,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME","");
  psVar4 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&no_configurations);
  pcVar3 = (psVar4->_M_dataplus)._M_p;
  no_component._M_dataplus._M_p = (pointer)&no_component.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&no_component,pcVar3,pcVar3 + psVar4->_M_string_length);
  if (no_configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(no_configurations.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((no_configurations.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  message = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
  pcVar2 = (this->super_cmCommand).Makefile;
  this_00 = (cmInstallFilesGenerator *)operator_new(0x120);
  cmInstallFilesGenerator::cmInstallFilesGenerator
            (this_00,&this->Files,destination._M_dataplus._M_p,false,"",&no_configurations,
             no_component._M_dataplus._M_p,message,false,"",false);
  cmMakefile::AddInstallGenerator(pcVar2,(cmInstallGenerator *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_configurations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)no_component._M_dataplus._M_p != &no_component.field_2) {
    operator_delete(no_component._M_dataplus._M_p,no_component.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)destination._M_dataplus._M_p != &destination.field_2) {
    operator_delete(destination._M_dataplus._M_p,destination.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallFilesCommand::CreateInstallGenerator() const
{
  // Construct the destination.  This command always installs under
  // the prefix.  We skip the leading slash given by the user.
  std::string destination = this->Destination.substr(1);
  cmSystemTools::ConvertToUnixSlashes(destination);
  if (destination.empty()) {
    destination = ".";
  }

  // Use a file install generator.
  const char* no_permissions = "";
  const char* no_rename = "";
  bool no_exclude_from_all = false;
  std::string no_component =
    this->Makefile->GetSafeDefinition("CMAKE_INSTALL_DEFAULT_COMPONENT_NAME");
  std::vector<std::string> no_configurations;
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);
  this->Makefile->AddInstallGenerator(new cmInstallFilesGenerator(
    this->Files, destination.c_str(), false, no_permissions, no_configurations,
    no_component.c_str(), message, no_exclude_from_all, no_rename));
}